

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O0

size_t minisketch_merge(minisketch *sketch,minisketch *other_sketch)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Sketch *s2;
  Sketch *s1;
  Sketch *in_stack_ffffffffffffffb8;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sketch::Check(in_stack_ffffffffffffffb8);
  Sketch::Check(in_stack_ffffffffffffffb8);
  iVar2 = Sketch::Bits(in_stack_ffffffffffffffb8);
  iVar3 = Sketch::Bits(in_stack_ffffffffffffffb8);
  if (iVar2 == iVar3) {
    iVar2 = Sketch::Implementation(in_stack_ffffffffffffffb8);
    iVar3 = Sketch::Implementation(in_stack_ffffffffffffffb8);
    if (iVar2 == iVar3) {
      local_10 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_RSI);
    }
    else {
      local_10 = 0;
    }
  }
  else {
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

size_t minisketch_merge(minisketch* sketch, const minisketch* other_sketch) {
    Sketch* s1 = (Sketch*)sketch;
    const Sketch* s2 = (const Sketch*)other_sketch;
    s1->Check();
    s2->Check();
    if (s1->Bits() != s2->Bits()) return 0;
    if (s1->Implementation() != s2->Implementation()) return 0;
    return s1->Merge(s2);
}